

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_sdl.cpp
# Opt level: O0

void ImGui_ImplSDL2_NewFrame(SDL_Window *window)

{
  bool bVar1;
  int iVar2;
  Uint64 UVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float local_64;
  Uint64 current_time;
  ImVec2 local_38;
  ImVec2 local_30;
  int local_28;
  int local_24;
  int display_h;
  int display_w;
  int h;
  int w;
  ImGuiIO *io;
  SDL_Window *window_local;
  
  io = (ImGuiIO *)window;
  _h = ImGui::GetIO();
  bVar1 = ImFontAtlas::IsBuilt(_h->Fonts);
  if (!bVar1) {
    __assert_fail("io.Fonts->IsBuilt() && \"Font atlas not built! It is generally built by the renderer back-end. Missing call to renderer _NewFrame() function? e.g. ImGui_ImplOpenGL3_NewFrame().\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/Green-Sky[P]imgui_entt_entity_editor_demo/external/imgui/impl/imgui_impl_sdl.cpp"
                  ,0x143,"void ImGui_ImplSDL2_NewFrame(SDL_Window *)");
  }
  SDL_GetWindowSize(io,&display_w,&display_h);
  SDL_GL_GetDrawableSize(io,&local_24,&local_28);
  ImVec2::ImVec2(&local_30,(float)display_w,(float)display_h);
  _h->DisplaySize = local_30;
  if ((0 < display_w) && (0 < display_h)) {
    ImVec2::ImVec2(&local_38,(float)local_24 / (float)display_w,(float)local_28 / (float)display_h);
    _h->DisplayFramebufferScale = local_38;
  }
  if ((ImGui_ImplSDL2_NewFrame(SDL_Window*)::frequency == '\0') &&
     (iVar2 = __cxa_guard_acquire(&ImGui_ImplSDL2_NewFrame(SDL_Window*)::frequency), iVar2 != 0)) {
    ImGui_ImplSDL2_NewFrame::frequency = SDL_GetPerformanceFrequency();
    __cxa_guard_release(&ImGui_ImplSDL2_NewFrame(SDL_Window*)::frequency);
  }
  UVar3 = SDL_GetPerformanceCounter();
  if (g_Time == 0) {
    local_64 = 0.016666668;
  }
  else {
    lVar4 = UVar3 - g_Time;
    auVar5._8_4_ = (int)((ulong)lVar4 >> 0x20);
    auVar5._0_8_ = lVar4;
    auVar5._12_4_ = 0x45300000;
    auVar6._8_4_ = (int)(ImGui_ImplSDL2_NewFrame::frequency >> 0x20);
    auVar6._0_8_ = ImGui_ImplSDL2_NewFrame::frequency;
    auVar6._12_4_ = 0x45300000;
    local_64 = (float)(((auVar5._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)) /
                      ((auVar6._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)ImGui_ImplSDL2_NewFrame::frequency) -
                      4503599627370496.0)));
  }
  _h->DeltaTime = local_64;
  g_Time = UVar3;
  ImGui_ImplSDL2_UpdateMousePosAndButtons();
  ImGui_ImplSDL2_UpdateMouseCursor();
  ImGui_ImplSDL2_UpdateGamepads();
  return;
}

Assistant:

void ImGui_ImplSDL2_NewFrame(SDL_Window* window)
{
    ImGuiIO& io = ImGui::GetIO();
    IM_ASSERT(io.Fonts->IsBuilt() && "Font atlas not built! It is generally built by the renderer back-end. Missing call to renderer _NewFrame() function? e.g. ImGui_ImplOpenGL3_NewFrame().");

    // Setup display size (every frame to accommodate for window resizing)
    int w, h;
    int display_w, display_h;
    SDL_GetWindowSize(window, &w, &h);
    SDL_GL_GetDrawableSize(window, &display_w, &display_h);
    io.DisplaySize = ImVec2((float)w, (float)h);
    if (w > 0 && h > 0)
        io.DisplayFramebufferScale = ImVec2((float)display_w / w, (float)display_h / h);

    // Setup time step (we don't use SDL_GetTicks() because it is using millisecond resolution)
    static Uint64 frequency = SDL_GetPerformanceFrequency();
    Uint64 current_time = SDL_GetPerformanceCounter();
    io.DeltaTime = g_Time > 0 ? (float)((double)(current_time - g_Time) / frequency) : (float)(1.0f / 60.0f);
    g_Time = current_time;

    ImGui_ImplSDL2_UpdateMousePosAndButtons();
    ImGui_ImplSDL2_UpdateMouseCursor();

    // Update game controllers (if enabled and available)
    ImGui_ImplSDL2_UpdateGamepads();
}